

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_map_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashMap_Swap_Test::~ParallelFlatHashMap_Swap_Test
          (ParallelFlatHashMap_Swap_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, Swap) {
    using Map = ThisMap<int, int>;
    using MapB = ThisMap_NullMutex<int, int>;
    
    Map t;
    EXPECT_TRUE(t.find(0) == t.end());
    auto res = t.emplace(0, 1);
    EXPECT_TRUE(res.second);
    EXPECT_EQ(1, t.size());
    MapB u;
    t.swap(u);
    EXPECT_EQ(0, t.size());
    EXPECT_EQ(1, u.size());
    EXPECT_TRUE(t.find(0) == t.end());
    EXPECT_TRUE(u[0] == 1);
}